

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O2

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateRayTracingBuiltinsAtReference
          (BuiltInsValidator *this,Decoration *decoration,Instruction *built_in_inst,
          Instruction *referenced_inst,Instruction *referenced_from_inst)

{
  _Rb_tree_color execution_model;
  ValidationState_t *pVVar1;
  bool bVar2;
  BuiltIn BVar3;
  StorageClass SVar4;
  uint32_t uVar5;
  _Rb_tree_node_base *p_Var6;
  mapped_type *this_00;
  char *pcVar7;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  uint32_t local_26c;
  string local_268;
  string local_248;
  string local_228;
  undefined1 local_208 [464];
  spv_result_t local_38;
  
  bVar2 = spvIsVulkanEnv(this->_->context_->target_env);
  if (bVar2) {
    BVar3 = Decoration::builtin(decoration);
    SVar4 = GetStorageClass(referenced_from_inst);
    if ((SVar4 == Input) || (SVar4 == Max)) {
      p_Var6 = (this->execution_models_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_001a20d6:
      if ((_Rb_tree_header *)p_Var6 == &(this->execution_models_)._M_t._M_impl.super__Rb_tree_header
         ) goto LAB_001a2149;
      execution_model = p_Var6[1]._M_color;
      switch(BVar3) {
      case BuiltInLaunchIdKHR:
      case BuiltInLaunchSizeKHR:
        if (5 < execution_model - 0x14c1) break;
LAB_001a213f:
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
        goto LAB_001a20d6;
      case BuiltInWorldRayOriginKHR:
      case BuiltInWorldRayDirectionKHR:
      case BuiltInRayTminKHR:
      case BuiltInRayTmaxKHR:
      case BuiltInIncomingRayFlagsKHR:
switchD_001a20eb_caseD_14c9:
        if (execution_model - 0x14c2 < 4) goto LAB_001a213f;
        break;
      case BuiltInObjectRayOriginKHR:
      case BuiltInObjectRayDirectionKHR:
      case BuiltInInstanceCustomIndexKHR:
      case BuiltInObjectToWorldKHR:
      case BuiltInWorldToObjectKHR:
      case BuiltInRayGeometryIndexKHR:
switchD_001a20eb_caseD_14cb:
        if (execution_model - 0x14c2 < 3) goto LAB_001a213f;
        break;
      case 0x14d0:
      case 0x14d1:
      case BuiltInCurrentRayTimeNV:
      case BuiltInHitTriangleVertexPositionsKHR:
      case 0x14d8:
      case BuiltInHitMicroTriangleVertexPositionsNV:
      case 0x14da:
      case 0x14db:
      case 0x14dc:
      case 0x14dd:
      case 0x14de:
      case 0x14df:
      case BuiltInHitMicroTriangleVertexBarycentricsNV:
      case BuiltInHitMicroTriangleVertexBarycentricsNV|BuiltInPointSize:
      case 0x14e2:
      case BuiltInHitMicroTriangleVertexBarycentricsNV|BuiltInClipDistance:
      case BuiltInHitMicroTriangleVertexBarycentricsNV|BuiltInCullDistance:
      case BuiltInHitMicroTriangleVertexBarycentricsNV|BuiltInVertexId:
      case BuiltInHitMicroTriangleVertexBarycentricsNV|BuiltInInstanceId:
        break;
      case BuiltInHitTNV:
      case BuiltInHitKindKHR:
        if (execution_model - 0x14c3 < 2) goto LAB_001a213f;
        break;
      default:
        if (BVar3 == BuiltInInstanceId) goto switchD_001a20eb_caseD_14cb;
        if (BVar3 == BuiltInCullMaskKHR) goto switchD_001a20eb_caseD_14c9;
      }
      uVar5 = GetVUIDForBuiltin(BVar3,VUIDErrorExecutionModel);
      ValidationState_t::diag
                ((DiagnosticStream *)local_208,this->_,SPV_ERROR_INVALID_DATA,referenced_from_inst);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_268,this->_,uVar5,(char *)0x0);
      std::operator<<((ostream *)local_208,(string *)&local_268);
      std::operator<<((ostream *)local_208,"Vulkan spec does not allow BuiltIn ");
      pVVar1 = this->_;
      BVar3 = Decoration::builtin(decoration);
      pcVar7 = AssemblyGrammar::lookupOperandName(&pVVar1->grammar_,SPV_OPERAND_TYPE_BUILT_IN,BVar3)
      ;
      std::operator<<((ostream *)local_208,pcVar7);
      std::operator<<((ostream *)local_208," to be used with the execution model ");
      pcVar7 = AssemblyGrammar::lookupOperandName
                         (&this->_->grammar_,SPV_OPERAND_TYPE_EXECUTION_MODEL,execution_model);
      std::operator<<((ostream *)local_208,pcVar7);
      std::operator<<((ostream *)local_208,".\n");
      (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                (&local_248,this,decoration,built_in_inst,referenced_inst,referenced_from_inst,
                 execution_model);
      std::operator<<((ostream *)local_208,(string *)&local_248);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      goto LAB_001a241b;
    }
    uVar5 = GetVUIDForBuiltin(BVar3,VUIDErrorStorageClass);
    ValidationState_t::diag
              ((DiagnosticStream *)local_208,this->_,SPV_ERROR_INVALID_DATA,referenced_from_inst);
    ValidationState_t::VkErrorID_abi_cxx11_(&local_268,this->_,uVar5,(char *)0x0);
    std::operator<<((ostream *)local_208,(string *)&local_268);
    std::operator<<((ostream *)local_208,"Vulkan spec allows BuiltIn ");
    pVVar1 = this->_;
    BVar3 = Decoration::builtin(decoration);
    pcVar7 = AssemblyGrammar::lookupOperandName(&pVVar1->grammar_,SPV_OPERAND_TYPE_BUILT_IN,BVar3);
    std::operator<<((ostream *)local_208,pcVar7);
    std::operator<<((ostream *)local_208," to be only used for variables with Input storage class. "
                   );
    (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
              (&local_248,this,decoration,built_in_inst,referenced_inst,referenced_from_inst,
               ExecutionModelMax);
    std::operator<<((ostream *)local_208,(string *)&local_248);
    std::operator<<((ostream *)local_208," ");
    (anonymous_namespace)::BuiltInsValidator::GetStorageClassDesc_abi_cxx11_
              (&local_228,this,referenced_from_inst);
    std::operator<<((ostream *)local_208,(string *)&local_228);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
LAB_001a241b:
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
  }
  else {
LAB_001a2149:
    local_38 = SPV_SUCCESS;
    if (this->function_id_ == 0) {
      local_26c = (referenced_from_inst->inst_).result_id;
      this_00 = std::
                map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
                ::operator[](&this->id_to_at_reference_checks_,&local_26c);
      local_248._M_dataplus._M_p = (pointer)ValidateRayTracingBuiltinsAtReference;
      local_248._M_string_length = 0;
      local_228._M_dataplus._M_p = (pointer)this;
      std::
      bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
                ((type *)local_208,(offset_in_BuiltInsValidator_to_subr *)&local_248,
                 (BuiltInsValidator **)&local_228,decoration,built_in_inst,referenced_from_inst,
                 (_Placeholder<1> *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      std::function<spv_result_t(spvtools::val::Instruction_const&)>::
      function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
                ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_268,
                 (type *)local_208);
      std::__cxx11::
      list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
      ::push_back(this_00,(value_type *)&local_268);
      if ((code *)local_268.field_2._M_allocated_capacity != (code *)0x0) {
        (*(code *)local_268.field_2._M_allocated_capacity)(&local_268,&local_268,3);
      }
      std::
      _Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
      ::~_Tuple_impl((_Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      *)(local_208 + 0x10));
      local_38 = SPV_SUCCESS;
    }
  }
  return local_38;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateRayTracingBuiltinsAtReference(
    const Decoration& decoration, const Instruction& built_in_inst,
    const Instruction& referenced_inst,
    const Instruction& referenced_from_inst) {
  if (spvIsVulkanEnv(_.context()->target_env)) {
    const spv::BuiltIn builtin = decoration.builtin();
    const spv::StorageClass storage_class = GetStorageClass(referenced_from_inst);
    if (storage_class != spv::StorageClass::Max &&
        storage_class != spv::StorageClass::Input) {
      uint32_t vuid = GetVUIDForBuiltin(builtin, VUIDErrorStorageClass);
      return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
             << _.VkErrorID(vuid) << "Vulkan spec allows BuiltIn "
             << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN,
                                              (uint32_t)decoration.builtin())
             << " to be only used for variables with Input storage class. "
             << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                 referenced_from_inst)
             << " " << GetStorageClassDesc(referenced_from_inst);
    }

    for (const spv::ExecutionModel execution_model : execution_models_) {
      if (!IsExecutionModelValidForRtBuiltIn(builtin, execution_model)) {
        uint32_t vuid = GetVUIDForBuiltin(builtin, VUIDErrorExecutionModel);
        return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
               << _.VkErrorID(vuid) << "Vulkan spec does not allow BuiltIn "
               << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN,
                                                (uint32_t)decoration.builtin())
               << " to be used with the execution model "
               << _.grammar().lookupOperandName(
                      SPV_OPERAND_TYPE_EXECUTION_MODEL,
                      uint32_t(execution_model))
               << ".\n"
               << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                   referenced_from_inst, execution_model);
      }
    }
  }

  if (function_id_ == 0) {
    // Propagate this rule to all dependant ids in the global scope.
    id_to_at_reference_checks_[referenced_from_inst.id()].push_back(
        std::bind(&BuiltInsValidator::ValidateRayTracingBuiltinsAtReference,
                  this, decoration, built_in_inst, referenced_from_inst,
                  std::placeholders::_1));
  }

  return SPV_SUCCESS;
}